

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O1

void calc_mean_and_sd_<float,int,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,float *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  int *piVar11;
  long lVar12;
  ulong *puVar13;
  undefined1 auVar14 [16];
  double dVar15;
  double dVar16;
  double dVar17;
  undefined4 uVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar21 [16];
  ulong local_78;
  undefined8 local_68;
  
  lVar12 = (long)Xc_indptr[col_num];
  lVar4 = (long)Xc_indptr[col_num + 1];
  if (Xc_indptr[col_num] == Xc_indptr[col_num + 1]) {
    *x_sd = 0.0;
    *x_mean = 0.0;
  }
  else {
    puVar13 = ix_arr + st;
    puVar10 = ix_arr + end + 1;
    uVar6 = (long)puVar10 - (long)puVar13 >> 3;
    if (0 < (long)uVar6) {
      do {
        uVar5 = uVar6 >> 1;
        uVar9 = ~uVar5 + uVar6;
        uVar6 = uVar5;
        if (puVar13[uVar5] < (ulong)(long)Xc_ind[lVar12]) {
          puVar13 = puVar13 + uVar5 + 1;
          uVar6 = uVar9;
        }
      } while (0 < (long)uVar6);
    }
    local_78 = (end - st) + 1;
    uVar6 = 0;
    local_68._0_4_ = 0;
    local_68._4_4_ = 0;
    if ((puVar13 == puVar10) || (lVar4 == lVar12)) {
      dVar16 = 0.0;
    }
    else {
      iVar2 = Xc_ind[lVar4 + -1];
      uVar6 = 0;
      dVar16 = 0.0;
      while (uVar5 = *puVar13, uVar5 <= (ulong)(long)iVar2) {
        piVar1 = Xc_ind + lVar12;
        iVar3 = *piVar1;
        if (iVar3 == (int)uVar5) {
          if ((uint)ABS(Xc[lVar12]) < 0x7f800000) {
            dVar15 = (double)Xc[lVar12];
            dVar17 = dVar15;
            if (uVar6 != 0) {
              dVar17 = (double)CONCAT44(local_68._4_4_,(undefined4)local_68);
            }
            uVar6 = uVar6 + 1;
            auVar21._8_4_ = (int)(uVar6 >> 0x20);
            auVar21._0_8_ = uVar6;
            auVar21._12_4_ = 0x45300000;
            local_68 = (double)CONCAT44(local_68._4_4_,(undefined4)local_68) +
                       (dVar15 - (double)CONCAT44(local_68._4_4_,(undefined4)local_68)) /
                       ((auVar21._8_8_ - 1.9342813113834067e+25) +
                       ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0));
            dVar16 = fma(dVar15 - local_68,dVar15 - dVar17,dVar16);
          }
          else {
            local_78 = local_78 - 1;
          }
          local_68._4_4_ = (undefined4)((ulong)local_68 >> 0x20);
          if ((puVar13 == ix_arr + end) || (lVar12 == lVar4 + -1)) break;
          piVar11 = piVar1 + 1;
          puVar13 = puVar13 + 1;
          uVar5 = (long)Xc_ind + (lVar4 * 4 - (long)piVar11) >> 2;
          if (0 < (long)uVar5) {
            do {
              uVar9 = uVar5 >> 1;
              uVar7 = ~uVar9 + uVar5;
              uVar5 = uVar9;
              if ((ulong)(long)(piVar11 + uVar9 + 1)[-1] < *puVar13) {
                piVar11 = piVar11 + uVar9 + 1;
                uVar5 = uVar7;
              }
            } while (0 < (long)uVar5);
          }
LAB_00269016:
          lVar12 = (long)piVar11 - (long)Xc_ind >> 2;
        }
        else {
          if (iVar3 <= (int)uVar5) {
            piVar11 = piVar1 + 1;
            uVar9 = (long)Xc_ind + (lVar4 * 4 - (long)(piVar1 + 1)) >> 2;
            while (0 < (long)uVar9) {
              uVar7 = uVar9 >> 1;
              uVar8 = ~uVar7 + uVar9;
              uVar9 = uVar7;
              if ((ulong)(long)(piVar11 + uVar7 + 1)[-1] < uVar5) {
                piVar11 = piVar11 + uVar7 + 1;
                uVar9 = uVar8;
              }
            }
            goto LAB_00269016;
          }
          puVar13 = puVar13 + 1;
          uVar5 = (long)puVar10 - (long)puVar13 >> 3;
          while (0 < (long)uVar5) {
            uVar9 = uVar5 >> 1;
            uVar7 = ~uVar9 + uVar5;
            uVar5 = uVar9;
            if (puVar13[uVar9] < (ulong)(long)iVar3) {
              puVar13 = puVar13 + uVar9 + 1;
              uVar5 = uVar7;
            }
          }
        }
        if ((puVar13 == puVar10) || (lVar12 == lVar4)) break;
      }
    }
    dVar17 = (double)CONCAT44(local_68._4_4_,(undefined4)local_68);
    if (uVar6 == 0) {
      *x_mean = 0.0;
      dVar16 = 0.0;
    }
    else {
      uVar20 = (undefined4)(local_78 >> 0x20);
      if (uVar6 < local_78) {
        auVar18._8_4_ = (int)(uVar6 >> 0x20);
        auVar18._0_8_ = uVar6;
        auVar18._12_4_ = 0x45300000;
        dVar15 = (auVar18._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)uVar6) - 4503599627370496.0);
        auVar19._8_4_ = uVar20;
        auVar19._0_8_ = local_78;
        auVar19._12_4_ = 0x45300000;
        dVar17 = dVar15 / ((auVar19._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0));
        dVar16 = dVar16 + (1.0 - dVar17) * dVar15 *
                          (double)CONCAT44(local_68._4_4_,(undefined4)local_68) *
                          (double)CONCAT44(local_68._4_4_,(undefined4)local_68);
        dVar17 = (double)CONCAT44(local_68._4_4_,(undefined4)local_68) * dVar17;
      }
      auVar14._8_4_ = uVar20;
      auVar14._0_8_ = local_78;
      auVar14._12_4_ = 0x45300000;
      *x_mean = dVar17;
      dVar16 = SQRT(dVar16 / ((auVar14._8_8_ - 1.9342813113834067e+25) +
                             ((double)CONCAT44(0x43300000,(int)local_78) - 4503599627370496.0)));
    }
    *x_sd = dVar16;
  }
  return;
}

Assistant:

void calc_mean_and_sd_(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                      real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                      double &restrict x_sd, double &restrict x_mean)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    size_t cnt = end - st + 1;
    size_t added = 0;
    real_t m = 0;
    real_t s = 0;
    real_t m_prev = 0;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt--;
            }

            else
            {
                if (added == 0) m_prev = Xc[curr_pos];
                m += (Xc[curr_pos] - m) / (real_t)(++added);
                s  = std::fma(Xc[curr_pos] - m, Xc[curr_pos] - m_prev, s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * ((real_t)added * ((real_t)1 - (real_t)added/(real_t)cnt));
        m *= (real_t)added / (real_t)cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (real_t)cnt);
}